

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  TValue *pTVar1;
  char *__s;
  uint uVar2;
  int iVar3;
  size_t lenx;
  GCstr *pGVar4;
  ulong uVar5;
  GCtab *t;
  
  uVar2 = lj_lib_checkint(L,1);
  iVar3 = 0;
  if (((uVar2 != 0) && (uVar5 = (ulong)(L->glref).ptr32, uVar2 < *(uint *)(uVar5 + 0x3c4))) &&
     (uVar5 = (ulong)*(uint *)(*(long *)(uVar5 + 0x3b8) + (ulong)uVar2 * 4), uVar5 != 0)) {
    lua_createtable(L,0,8);
    t = (GCtab *)(ulong)L->top[-1].u32.lo;
    setintfield(L,t,"nins",*(int *)(uVar5 + 8) + -0x8001);
    setintfield(L,t,"nk",0x8000 - *(int *)(uVar5 + 0x18));
    setintfield(L,t,"link",(uint)*(ushort *)(uVar5 + 0x52));
    setintfield(L,t,"nexit",(uint)*(ushort *)(uVar5 + 6));
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    __s = jit_trlinkname[*(byte *)(uVar5 + 0x5c)];
    lenx = strlen(__s);
    pGVar4 = lj_str_new(L,__s,lenx);
    (pTVar1->u32).lo = (uint32_t)pGVar4;
    (pTVar1->field_2).it = 0xfffffffb;
    lua_setfield(L,-2,"linktype");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}